

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_A_Overlay(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  uint layer_00;
  DObject *this;
  player_t *this_00;
  DPSprite *pDVar1;
  PClass *len;
  bool bVar2;
  bool local_96;
  bool local_93;
  int u_1;
  DPSprite *pspr;
  int u;
  player_t *player;
  FState *pFStack_60;
  bool dontoverride;
  FState *state;
  int layer;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x47b,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x47b,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_93 = true;
  len = (PClass *)param;
  if (this != (DObject *)0x0) {
    len = AActor::RegistrationInfo.MyClass;
    local_93 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_93 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x47b,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  stateinfo = (FStateParamInfo *)this;
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
      bVar2 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x47b,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    stateinfo = (FStateParamInfo *)param[1].field_0.field_1.a;
    local_96 = true;
    if ((DObject *)stateinfo != (DObject *)0x0) {
      len = AActor::RegistrationInfo.MyClass;
      local_96 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
    }
    if (local_96 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x47b,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
      bVar2 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x47b,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x47c,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x47c,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  layer_00 = param[3].field_0.i;
  if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
    pFStack_60 = (FState *)0x0;
  }
  else {
    bVar2 = false;
    if ((param[4].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[4].field_0.field_1.atag != 7)) {
      bVar2 = param[4].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x47d,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    pFStack_60 = (FState *)param[4].field_0.field_1.a;
  }
  if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
    bVar2 = false;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x47e,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    bVar2 = param[5].field_0.i != 0;
  }
  this_00 = *(player_t **)&this[0xc].ObjectFlags;
  if (this_00 == (player_t *)0x0) {
LAB_006a94ad:
    if (numret < 1) {
      stack_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x484,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      VMReturn::SetInt(ret,0);
      stack_local._4_4_ = 1;
    }
  }
  else {
    if (bVar2) {
      len = (PClass *)(ulong)layer_00;
      pDVar1 = player_t::FindPSprite(this_00,layer_00);
      if (pDVar1 != (DPSprite *)0x0) goto LAB_006a94ad;
    }
    pDVar1 = (DPSprite *)DObject::operator_new((DObject *)0x88,(size_t)len);
    DPSprite::DPSprite(pDVar1,this_00,(AActor *)stateinfo,layer_00);
    DPSprite::SetState(pDVar1,pFStack_60,false);
    if (numret < 1) {
      stack_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x48a,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      VMReturn::SetInt(ret,1);
      stack_local._4_4_ = 1;
    }
  }
  return stack_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_Overlay)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT		(layer);
	PARAM_STATE_OPT	(state) { state = nullptr; }
	PARAM_BOOL_OPT	(dontoverride)	{ dontoverride = false; }

	player_t *player = self->player;

	if (player == nullptr || (dontoverride && (player->FindPSprite(layer) != nullptr)))
	{
		ACTION_RETURN_BOOL(false);
	}

	DPSprite *pspr;
	pspr = new DPSprite(player, stateowner, layer);
	pspr->SetState(state);
	ACTION_RETURN_BOOL(true);
}